

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O3

ly_bool lyd_is_default(lyd_node *node)

{
  lysc_node *plVar1;
  int iVar2;
  void *pvVar3;
  lys_module *plVar4;
  lysc_node *plVar5;
  void *pvVar6;
  
  plVar1 = node->schema;
  if ((plVar1->nodetype & 0xc) != 0) {
    plVar5 = plVar1[1].prev;
    if (plVar1->nodetype == 4) {
      if ((plVar5 != (lysc_node *)0x0) &&
         (iVar2 = (*(code *)(plVar1[1].parent)->parent->next)(plVar1->module->ctx,node + 1),
         iVar2 == 0)) {
        return '\x01';
      }
    }
    else if (plVar5 != (lysc_node *)0x0) {
      pvVar6 = (void *)0x0;
      while( true ) {
        if (plVar5 == (lysc_node *)0x0) {
          pvVar3 = (void *)0x0;
        }
        else {
          pvVar3 = plVar5[-1].priv;
        }
        if (pvVar3 <= pvVar6) {
          return '\0';
        }
        plVar4 = (lys_module *)&node[2].schema;
        if (node->schema != (lysc_node *)0x0) {
          plVar4 = node->schema->module;
        }
        iVar2 = (*(code *)(plVar1[1].parent)->parent->next)
                          (plVar4->ctx,node + 1,
                           *(undefined8 *)(plVar5->hash + (long)pvVar6 * 8 + -4));
        if (iVar2 == 0) break;
        pvVar6 = (void *)((long)pvVar6 + 1);
        plVar5 = plVar1[1].prev;
      }
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

LIBYANG_API_DEF ly_bool
lyd_is_default(const struct lyd_node *node)
{
    const struct lysc_node_leaf *leaf;
    const struct lysc_node_leaflist *llist;
    const struct lyd_node_term *term;
    LY_ARRAY_COUNT_TYPE u;

    if (!(node->schema->nodetype & LYD_NODE_TERM)) {
        return 0;
    }

    term = (const struct lyd_node_term *)node;

    if (node->schema->nodetype == LYS_LEAF) {
        leaf = (const struct lysc_node_leaf *)node->schema;
        if (!leaf->dflt) {
            return 0;
        }

        /* compare with the default value */
        if (!leaf->type->plugin->compare(LYD_CTX(node), &term->value, leaf->dflt)) {
            return 1;
        }
    } else {
        llist = (const struct lysc_node_leaflist *)node->schema;
        if (!llist->dflts) {
            return 0;
        }

        LY_ARRAY_FOR(llist->dflts, u) {
            /* compare with each possible default value */
            if (!llist->type->plugin->compare(LYD_CTX(node), &term->value, llist->dflts[u])) {
                return 1;
            }
        }
    }

    return 0;
}